

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

void __thiscall
SmallDenseMap<VmInstruction_*,_VmInstruction_*,_VmInstructionHasher,_16U>::insert
          (SmallDenseMap<VmInstruction_*,_VmInstruction_*,_VmInstructionHasher,_16U> *this,
          VmInstruction **key,VmInstruction **value)

{
  Node *pNVar1;
  uint uVar2;
  Node *pNVar3;
  VmInstruction *pVVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  
  if (*key == (VmInstruction *)0x0) {
    __assert_fail("key != Key()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                  ,0x3b,
                  "void SmallDenseMap<VmInstruction *, VmInstruction *, VmInstructionHasher, 16>::insert(const Key &, const Value &) [Key = VmInstruction *, Value = VmInstruction *, Hasher = VmInstructionHasher, N = 16]"
                 );
  }
  if (this->bucketCount <= (this->count >> 2) + this->count) {
    rehash(this);
  }
  uVar2 = this->bucketCount;
  if (uVar2 != 0) {
    uVar5 = this->count;
    uVar6 = (*key)->uniqueId & uVar2 - 1;
    pNVar3 = this->data;
    uVar7 = 1;
    do {
      pNVar1 = pNVar3 + uVar6;
      pVVar4 = pNVar3[uVar6].key;
      if (pVVar4 == (VmInstruction *)0x0) {
        pNVar1->key = *key;
        pNVar1->value = *value;
        uVar5 = uVar5 + 1;
        this->count = uVar5;
LAB_002937d2:
        bVar8 = false;
      }
      else {
        if (pVVar4 == *key) {
          pNVar1->value = *value;
          goto LAB_002937d2;
        }
        uVar6 = uVar6 + uVar7 & uVar2 - 1;
        bVar8 = true;
      }
      if (!bVar8) {
        return;
      }
      bVar8 = uVar7 != uVar2;
      uVar7 = uVar7 + 1;
    } while (bVar8);
  }
  __assert_fail("!\"couldn\'t insert node\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                ,0x5b,
                "void SmallDenseMap<VmInstruction *, VmInstruction *, VmInstructionHasher, 16>::insert(const Key &, const Value &) [Key = VmInstruction *, Value = VmInstruction *, Hasher = VmInstructionHasher, N = 16]"
               );
}

Assistant:

void insert(const Key& key, const Value& value)
	{
		// Default value is used as an empty marker
		assert(key != Key());

		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
			{
				item.key = key;
				item.value = value;

				count++;
				return;
			}

			if(item.key == key)
			{
				item.value = value;
				return;
			}

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		assert(!"couldn't insert node");
	}